

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DeepTiledInputFile::multiPartInitialize(DeepTiledInputFile *this,InputPartData *part)

{
  bool bVar1;
  undefined1 uVar2;
  ostream *poVar3;
  string *psVar4;
  ArgExc *this_00;
  undefined8 uVar5;
  long in_RSI;
  long in_RDI;
  stringstream _iex_throw_s;
  DeepTiledInputFile *in_stack_00000200;
  string *in_stack_fffffffffffffe10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe60;
  Header *in_stack_fffffffffffffe68;
  Header *in_stack_fffffffffffffe70;
  ostream local_188 [8];
  bool *in_stack_fffffffffffffe80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe88;
  TileOffsets *in_stack_fffffffffffffe90;
  
  Header::type_abi_cxx11_((Header *)0x1cf7a1);
  bVar1 = isTiled(in_stack_fffffffffffffe10);
  if (!bVar1) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe68);
    poVar3 = std::operator<<(local_188,"Can\'t build a DeepTiledInputFile from a part of type ");
    psVar4 = Header::type_abi_cxx11_((Header *)0x1cf7ed);
    std::operator<<(poVar3,(string *)psVar4);
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(this_00,(stringstream *)&stack0xfffffffffffffe68);
    __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  *(undefined8 *)(*(long *)(in_RDI + 8) + 0x1d8) = *(undefined8 *)(in_RSI + 0x48);
  Header::operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  *(undefined4 *)(*(long *)(in_RDI + 8) + 0x70) = *(undefined4 *)(in_RSI + 0x40);
  *(undefined4 *)(*(long *)(in_RDI + 8) + 0x158) = *(undefined4 *)(in_RSI + 0x3c);
  uVar2 = (**(code **)(**(long **)(*(long *)(*(long *)(in_RDI + 8) + 0x1d8) + 0x28) + 0x10))();
  *(undefined1 *)(*(long *)(in_RDI + 8) + 0x188) = uVar2;
  initialize(in_stack_00000200);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  TileOffsets::readFrom
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_fffffffffffffe20);
  uVar5 = (**(code **)(**(long **)(*(long *)(*(long *)(in_RDI + 8) + 0x1d8) + 0x28) + 0x28))();
  *(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + 0x1d8) + 0x30) = uVar5;
  return;
}

Assistant:

void
DeepTiledInputFile::multiPartInitialize(InputPartData* part)
{
    if (isTiled(part->header.type()) == false)
        THROW (IEX_NAMESPACE::ArgExc, "Can't build a DeepTiledInputFile from a part of type " << part->header.type());

    _data->_streamData = part->mutex;
    _data->header = part->header;
    _data->version = part->version;
    _data->partNumber = part->partNumber;
    _data->memoryMapped = _data->_streamData->is->isMemoryMapped();
    initialize();
    _data->tileOffsets.readFrom(part->chunkOffsets , _data->fileIsComplete);
    _data->_streamData->currentPosition = _data->_streamData->is->tellg();
}